

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O0

dropt_stringstream * dropt_ssopen(void)

{
  dropt_char *pdVar1;
  dropt_stringstream *local_10;
  dropt_stringstream *ss;
  
  local_10 = (dropt_stringstream *)malloc(0x18);
  if (local_10 != (dropt_stringstream *)0x0) {
    local_10->used = 0;
    local_10->maxSize = 0x100;
    pdVar1 = (dropt_char *)dropt_safe_malloc(local_10->maxSize,1);
    local_10->string = pdVar1;
    if (local_10->string == (dropt_char *)0x0) {
      free(local_10);
      local_10 = (dropt_stringstream *)0x0;
    }
    else {
      *local_10->string = '\0';
    }
  }
  return local_10;
}

Assistant:

dropt_stringstream*
dropt_ssopen(void)
{
    dropt_stringstream* ss = malloc(sizeof *ss);
    if (ss != NULL)
    {
        ss->used = 0;
        ss->maxSize = default_stringstream_buffer_size;
        ss->string = dropt_safe_malloc(ss->maxSize, sizeof *ss->string);
        if (ss->string == NULL)
        {
            free(ss);
            ss = NULL;
        }
        else
        {
            ss->string[0] = DROPT_TEXT_LITERAL('\0');
        }
    }
    return ss;
}